

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::ResetMemory(void)

{
  ClearMemory();
  Tree<NULLC::Range>::reset((Tree<NULLC::Range> *)bigBlocks);
  if (blocksToFinalize != 0) {
    (*(code *)dealloc)();
  }
  blocksToFinalize = 0;
  uRam000000000041bec0 = 0;
  if (blocksToFree != 0) {
    (*(code *)dealloc)();
  }
  blocksToFree = 0;
  uRam000000000041bed0 = 0;
  if (finalizeList != 0) {
    (*(code *)dealloc)();
  }
  finalizeList = 0;
  uRam000000000041b888 = 0;
  GC::ResetGC();
  return;
}

Assistant:

void NULLC::ResetMemory()
{
	ClearMemory();

	bigBlocks.reset();

	blocksToFinalize.reset();
	blocksToFree.reset();

	finalizeList.reset();

	GC::ResetGC();
}